

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obmc_sad_test.cc
# Opt level: O2

void __thiscall
(anonymous_namespace)::ObmcSadTest_RandomValues_Test::~ObmcSadTest_RandomValues_Test
          (ObmcSadTest_RandomValues_Test *this)

{
  anon_unknown.dwarf_1b52ba8::ObmcSadTest_RandomValues_Test::~ObmcSadTest_RandomValues_Test
            ((ObmcSadTest_RandomValues_Test *)(this + -0x10));
  return;
}

Assistant:

TEST_P(ObmcSadTest, RandomValues) {
  DECLARE_ALIGNED(32, uint8_t, pre[MAX_SB_SQUARE]);
  DECLARE_ALIGNED(32, int32_t, wsrc[MAX_SB_SQUARE]);
  DECLARE_ALIGNED(32, int32_t, mask[MAX_SB_SQUARE]);

  for (int iter = 0; iter < kIterations && !HasFatalFailure(); ++iter) {
    const int pre_stride = rng_(MAX_SB_SIZE + 1);

    for (int i = 0; i < MAX_SB_SQUARE; ++i) {
      pre[i] = rng_.Rand8();
      wsrc[i] = rng_.Rand8() * rng_(kMaskMax * kMaskMax + 1);
      mask[i] = rng_(kMaskMax * kMaskMax + 1);
    }

    const unsigned int ref_res = params_.ref_func(pre, pre_stride, wsrc, mask);
    unsigned int tst_res;
    API_REGISTER_STATE_CHECK(tst_res =
                                 params_.tst_func(pre, pre_stride, wsrc, mask));

    ASSERT_EQ(ref_res, tst_res);
  }
}